

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::VertexAttributeTypeCase::test
          (VertexAttributeTypeCase *this)

{
  TestLog *pTVar1;
  long lVar2;
  GLuint local_2a0 [2];
  GLuint vaos [2];
  GLuint buf;
  allocator<char> local_269;
  string local_268;
  ScopedLogSection local_248;
  ScopedLogSection section_1;
  GLint local_238;
  int ndx_1;
  PointerData pointers_1 [6];
  int local_19c;
  GLint local_198;
  int ndx;
  PointerData pointers [11];
  undefined1 local_88 [8];
  GLfloat vertexData [4];
  string local_70;
  allocator<char> local_39;
  string local_38;
  ScopedLogSection local_18;
  ScopedLogSection section;
  VertexAttributeTypeCase *this_local;
  
  pTVar1 = (this->super_ApiCase).m_log;
  section.m_log = (TestLog *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"DefaultVAO",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Test with default VAO",(allocator<char> *)((long)vertexData + 0xf)
            );
  tcu::ScopedLogSection::ScopedLogSection(&local_18,pTVar1,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)vertexData + 0xf));
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  memset(local_88,0,0x10);
  local_198 = 1;
  ndx = 0x1400;
  pointers[0].size = 0;
  pointers[0].type._0_1_ = 0;
  pointers[0]._8_8_ = local_88;
  pointers[0].pointer._0_4_ = 1;
  pointers[0].pointer._4_4_ = 0x1402;
  pointers[1].size = 0;
  pointers[1].type._0_1_ = 0;
  pointers[1]._8_8_ = local_88;
  pointers[1].pointer._0_4_ = 1;
  pointers[1].pointer._4_4_ = 0x1404;
  pointers[2].size = 0;
  pointers[2].type._0_1_ = 0;
  pointers[2]._8_8_ = local_88;
  pointers[2].pointer._0_4_ = 1;
  pointers[2].pointer._4_4_ = 0x140c;
  pointers[3].size = 0;
  pointers[3].type._0_1_ = 0;
  pointers[3]._8_8_ = local_88;
  pointers[3].pointer._0_4_ = 1;
  pointers[3].pointer._4_4_ = 0x1406;
  pointers[4].size = 0;
  pointers[4].type._0_1_ = 0;
  pointers[4]._8_8_ = local_88;
  pointers[4].pointer._0_4_ = 1;
  pointers[4].pointer._4_4_ = 0x140b;
  pointers[5].size = 0;
  pointers[5].type._0_1_ = 0;
  pointers[5]._8_8_ = local_88;
  pointers[5].pointer._0_4_ = 1;
  pointers[5].pointer._4_4_ = 0x1401;
  pointers[6].size = 0;
  pointers[6].type._0_1_ = 0;
  pointers[6]._8_8_ = local_88;
  pointers[6].pointer._0_4_ = 1;
  pointers[6].pointer._4_4_ = 0x1403;
  pointers[7].size = 0;
  pointers[7].type._0_1_ = 0;
  pointers[7]._8_8_ = local_88;
  pointers[7].pointer._0_4_ = 1;
  pointers[7].pointer._4_4_ = 0x1405;
  pointers[8].size = 0;
  pointers[8].type._0_1_ = 0;
  pointers[8]._8_8_ = local_88;
  pointers[8].pointer._0_4_ = 4;
  pointers[8].pointer._4_4_ = 0x8d9f;
  pointers[9].size = 0;
  pointers[9].type._0_1_ = 0;
  pointers[9]._8_8_ = local_88;
  pointers[9].pointer._0_4_ = 4;
  pointers[9].pointer._4_4_ = 0x8368;
  pointers[10].size = 0;
  pointers[10].type._0_1_ = 0;
  pointers[10]._8_8_ = local_88;
  for (local_19c = 0; local_19c < 0xb; local_19c = local_19c + 1) {
    lVar2 = (long)local_19c;
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_ApiCase).super_CallLogWrapper,0,(&local_198)[lVar2 * 6],
               *(GLenum *)((long)&pointers[lVar2 + -1].pointer + 4),(GLboolean)pointers[lVar2].type,
               pointers[lVar2].size,*(void **)&pointers[lVar2].stride);
    ApiCase::expectError(&this->super_ApiCase,0);
    verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       &(this->super_ApiCase).super_CallLogWrapper,0,0x8625,
                       *(GLenum *)((long)&pointers[(long)local_19c + -1].pointer + 4));
  }
  local_238 = 1;
  ndx_1 = 0x1400;
  pointers_1[0].size = 0;
  pointers_1[0].type._0_1_ = 0;
  pointers_1[0]._8_8_ = local_88;
  pointers_1[0].pointer._0_4_ = 1;
  pointers_1[0].pointer._4_4_ = 0x1402;
  pointers_1[1].size = 0;
  pointers_1[1].type._0_1_ = 0;
  pointers_1[1]._8_8_ = local_88;
  pointers_1[1].pointer._0_4_ = 1;
  pointers_1[1].pointer._4_4_ = 0x1404;
  pointers_1[2].size = 0;
  pointers_1[2].type._0_1_ = 0;
  pointers_1[2]._8_8_ = local_88;
  pointers_1[2].pointer._0_4_ = 1;
  pointers_1[2].pointer._4_4_ = 0x1401;
  pointers_1[3].size = 0;
  pointers_1[3].type._0_1_ = 0;
  pointers_1[3]._8_8_ = local_88;
  pointers_1[3].pointer._0_4_ = 1;
  pointers_1[3].pointer._4_4_ = 0x1403;
  pointers_1[4].size = 0;
  pointers_1[4].type._0_1_ = 0;
  pointers_1[4]._8_8_ = local_88;
  pointers_1[4].pointer._0_4_ = 1;
  pointers_1[4].pointer._4_4_ = 0x1405;
  pointers_1[5].size = 0;
  pointers_1[5].type._0_1_ = 0;
  pointers_1[5]._8_8_ = local_88;
  for (section_1.m_log._4_4_ = 0; section_1.m_log._4_4_ < 6;
      section_1.m_log._4_4_ = section_1.m_log._4_4_ + 1) {
    lVar2 = (long)section_1.m_log._4_4_;
    glu::CallLogWrapper::glVertexAttribIPointer
              (&(this->super_ApiCase).super_CallLogWrapper,0,(&local_238)[lVar2 * 6],
               *(GLenum *)((long)&pointers_1[lVar2 + -1].pointer + 4),pointers_1[lVar2].size,
               *(void **)&pointers_1[lVar2].stride);
    ApiCase::expectError(&this->super_ApiCase,0);
    verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       &(this->super_ApiCase).super_CallLogWrapper,0,0x8625,
                       *(GLenum *)((long)&pointers_1[(long)section_1.m_log._4_4_ + -1].pointer + 4))
    ;
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_18);
  pTVar1 = (this->super_ApiCase).m_log;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"WithVAO",&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"Test with VAO",(allocator<char> *)((long)vaos + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_248,pTVar1,&local_268,(string *)&buf);
  std::__cxx11::string::~string((string *)&buf);
  std::allocator<char>::~allocator((allocator<char> *)((long)vaos + 7));
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  vaos[0] = 0;
  local_2a0[0] = 0;
  local_2a0[1] = 0;
  glu::CallLogWrapper::glGenVertexArrays(&(this->super_ApiCase).super_CallLogWrapper,2,local_2a0);
  glu::CallLogWrapper::glGenBuffers(&(this->super_ApiCase).super_CallLogWrapper,1,vaos);
  glu::CallLogWrapper::glBindBuffer(&(this->super_ApiCase).super_CallLogWrapper,0x8892,vaos[0]);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(&(this->super_ApiCase).super_CallLogWrapper,local_2a0[0]);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     &(this->super_ApiCase).super_CallLogWrapper,0,0x8625,0x1406);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glVertexAttribPointer
            (&(this->super_ApiCase).super_CallLogWrapper,0,1,0x1406,'\0',0,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(&(this->super_ApiCase).super_CallLogWrapper,local_2a0[1]);
  glu::CallLogWrapper::glVertexAttribPointer
            (&(this->super_ApiCase).super_CallLogWrapper,0,1,0x1402,'\0',0,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     &(this->super_ApiCase).super_CallLogWrapper,0,0x8625,0x1402);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(&(this->super_ApiCase).super_CallLogWrapper,local_2a0[0]);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     &(this->super_ApiCase).super_CallLogWrapper,0,0x8625,0x1406);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glDeleteVertexArrays(&(this->super_ApiCase).super_CallLogWrapper,2,local_2a0)
  ;
  glu::CallLogWrapper::glDeleteBuffers(&(this->super_ApiCase).super_CallLogWrapper,1,vaos);
  ApiCase::expectError(&this->super_ApiCase,0);
  tcu::ScopedLogSection::~ScopedLogSection(&local_248);
  return;
}

Assistant:

void test (void)
	{
		// Test with default VAO
		{
			const tcu::ScopedLogSection section(m_log, "DefaultVAO", "Test with default VAO");

			const GLfloat vertexData[4] = {0.0f}; // never accessed

			// test VertexAttribPointer
			{
				const PointerData pointers[] =
				{
					{ 1, GL_BYTE,								0,	GL_FALSE, vertexData	},
					{ 1, GL_SHORT,								0,	GL_FALSE, vertexData	},
					{ 1, GL_INT,								0,	GL_FALSE, vertexData	},
					{ 1, GL_FIXED,								0,	GL_FALSE, vertexData	},
					{ 1, GL_FLOAT,								0,	GL_FALSE, vertexData	},
					{ 1, GL_HALF_FLOAT,							0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_BYTE,						0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_SHORT,						0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_INT,						0,	GL_FALSE, vertexData	},
					{ 4, GL_INT_2_10_10_10_REV,					0,	GL_FALSE, vertexData	},
					{ 4, GL_UNSIGNED_INT_2_10_10_10_REV,		0,	GL_FALSE, vertexData	},
				};

				for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
				{
					glVertexAttribPointer(0, pointers[ndx].size, pointers[ndx].type, pointers[ndx].normalized, pointers[ndx].stride, pointers[ndx].pointer);
					expectError(GL_NO_ERROR);

					verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_TYPE, pointers[ndx].type);
				}
			}

			// test glVertexAttribIPointer
			{
				const PointerData pointers[] =
				{
					{ 1, GL_BYTE,								0,	GL_FALSE, vertexData	},
					{ 1, GL_SHORT,								0,	GL_FALSE, vertexData	},
					{ 1, GL_INT,								0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_BYTE,						0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_SHORT,						0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_INT,						0,	GL_FALSE, vertexData	},
				};

				for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
				{
					glVertexAttribIPointer(0, pointers[ndx].size, pointers[ndx].type, pointers[ndx].stride, pointers[ndx].pointer);
					expectError(GL_NO_ERROR);

					verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_TYPE, pointers[ndx].type);
				}
			}
		}

		// Test with multiple VAOs
		{
			const tcu::ScopedLogSection section(m_log, "WithVAO", "Test with VAO");

			GLuint buf		= 0;
			GLuint vaos[2]	= {0};

			glGenVertexArrays(2, vaos);
			glGenBuffers(1, &buf);
			glBindBuffer(GL_ARRAY_BUFFER, buf);
			expectError(GL_NO_ERROR);

			// initial
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_TYPE, GL_FLOAT);
			expectError(GL_NO_ERROR);

			// set vao 0 to some value
			glVertexAttribPointer(0, 1, GL_FLOAT, GL_FALSE, 0, DE_NULL);
			expectError(GL_NO_ERROR);

			// set vao 1 to some other value
			glBindVertexArray(vaos[1]);
			glVertexAttribPointer(0, 1, GL_SHORT, GL_FALSE, 0, DE_NULL);
			expectError(GL_NO_ERROR);

			// verify vao 1 state
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_TYPE, GL_SHORT);
			expectError(GL_NO_ERROR);

			// verify vao 0 state
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_TYPE, GL_FLOAT);
			expectError(GL_NO_ERROR);

			glDeleteVertexArrays(2, vaos);
			glDeleteBuffers(1, &buf);
			expectError(GL_NO_ERROR);
		}
	}